

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-optimizer.cpp
# Opt level: O3

result * baryonyx::itm::branch_optimize(result *__return_storage_ptr__,context *ctx,problem *pb)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  _Base_ptr __position;
  bool bVar5;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_header *p_Var7;
  problem_set jobs;
  result ret1;
  result ret0;
  context internal_ctx;
  tuple<baryonyx::problem,_baryonyx::problem> sp;
  double local_5a0;
  unsigned_long local_598;
  int local_58c;
  double *local_588;
  vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *local_580;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *local_578;
  vector<signed_char,_std::allocator<signed_char>_> *local_570;
  affected_variables *local_568;
  string_view *local_560;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_558;
  double *local_550;
  double *local_548;
  index *local_540;
  int *local_538;
  int *local_530;
  index *local_528;
  _Rb_tree<node,_node,_std::_Identity<node>,_node_result_compare,_std::allocator<node>_> local_520;
  result local_4f0;
  result local_448;
  context local_3a0;
  tuple<baryonyx::problem,_baryonyx::problem> local_220;
  
  notice<>(ctx,"- branch-optimization starts\n");
  context::context(&local_3a0,ctx);
  local_3a0.log_priority = warning;
  optimize(__return_storage_ptr__,&local_3a0,pb);
  if (__return_storage_ptr__->status == success) {
    notice<double>(&local_3a0,"  - branch optimization found solution {:f}\n",
                   &((__return_storage_ptr__->solutions).
                     super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>.
                     _M_impl.super__Vector_impl_data._M_start)->value);
    local_220.super__Tuple_impl<0UL,_baryonyx::problem,_baryonyx::problem>.
    super__Tuple_impl<1UL,_baryonyx::problem>.super__Head_base<1UL,_baryonyx::problem,_false>.
    _M_head_impl.strings.super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    if (__return_storage_ptr__->status == success) {
      local_220.super__Tuple_impl<0UL,_baryonyx::problem,_baryonyx::problem>.
      super__Tuple_impl<1UL,_baryonyx::problem>.super__Head_base<1UL,_baryonyx::problem,_false>.
      _M_head_impl.strings.super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)
               (__return_storage_ptr__->solutions).
               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].value;
    }
  }
  else {
    local_220.super__Tuple_impl<0UL,_baryonyx::problem,_baryonyx::problem>.
    super__Tuple_impl<1UL,_baryonyx::problem>.super__Head_base<1UL,_baryonyx::problem,_false>.
    _M_head_impl.strings.super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
  }
  local_520._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_520._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_520._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var7 = &local_520._M_impl.super__Rb_tree_header;
  local_520._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var7->_M_header;
  local_520._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var7->_M_header;
  std::_Rb_tree<node,node,std::_Identity<node>,node_result_compare,std::allocator<node>>::
  _M_emplace_equal<baryonyx::problem_const&,double,int&,int&>
            ((_Rb_tree<node,node,std::_Identity<node>,node_result_compare,std::allocator<node>> *)
             &local_520,pb,(double *)&local_220,&__return_storage_ptr__->remaining_constraints,
             &__return_storage_ptr__->annoying_variable);
  local_58c = __return_storage_ptr__->annoying_variable;
  local_558 = &(__return_storage_ptr__->strings).
               super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_560 = &__return_storage_ptr__->method;
  local_568 = &__return_storage_ptr__->affected_vars;
  local_548 = &local_448.duration;
  local_588 = &__return_storage_ptr__->duration;
  local_550 = &local_4f0.duration;
  local_528 = &local_448.remaining_constraints;
  local_540 = &local_4f0.remaining_constraints;
  local_530 = &local_448.annoying_variable;
  local_538 = &local_4f0.annoying_variable;
  local_578 = &__return_storage_ptr__->variable_name;
  local_570 = &(__return_storage_ptr__->affected_vars).values;
  local_580 = &__return_storage_ptr__->solutions;
  do {
    __position = local_520._M_impl.super__Rb_tree_header._M_header._M_left;
    notice<std::basic_string_view<char,std::char_traits<char>>,int>
              (&local_3a0,"  - branch-optimization splits on {} (id: {})\n",
               (basic_string_view<char,_std::char_traits<char>_> *)
               (&(local_520._M_impl.super__Rb_tree_header._M_header._M_left[5]._M_left)->_M_color +
               (long)*(int *)&local_520._M_impl.super__Rb_tree_header._M_header._M_left[9].field_0x4
               * 4),(int *)&local_520._M_impl.super__Rb_tree_header._M_header._M_left[9].field_0x4);
    split(&local_220,&local_3a0,(problem *)(__position + 1),local_58c);
    optimize(&local_448,&local_3a0,
             &local_220.super__Tuple_impl<0UL,_baryonyx::problem,_baryonyx::problem>.
              super__Head_base<0UL,_baryonyx::problem,_false>._M_head_impl);
    bVar5 = is_best(&local_3a0,&local_448,__return_storage_ptr__,
                    *(objective_function_type *)&__position[8]._M_left);
    if (bVar5) {
      (__return_storage_ptr__->strings).
      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_448.strings.super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (local_558,
                 &local_448.strings.
                  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      local_560->_M_len = local_448.method._M_len;
      local_560->_M_str = local_448.method._M_str;
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator=(&local_568->names,&local_448.affected_vars.names);
      std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                (local_570,&local_448.affected_vars.values);
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator=(local_578,&local_448.variable_name);
      std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::operator=
                (local_580,&local_448.solutions);
      dVar1 = *local_548;
      dVar2 = local_548[1];
      dVar3 = local_548[2];
      dVar4 = local_548[3];
      *(result_status *)(local_588 + 4) = *(result_status *)(local_548 + 4);
      *local_588 = dVar1;
      local_588[1] = dVar2;
      local_588[2] = dVar3;
      local_588[3] = dVar4;
    }
    local_4f0.strings.super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    if (local_448.status == success) {
      local_4f0.strings.super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)
               local_448.solutions.
               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].value;
    }
    std::_Rb_tree<node,node,std::_Identity<node>,node_result_compare,std::allocator<node>>::
    _M_emplace_equal<baryonyx::problem&,double,int&,int&>
              ((_Rb_tree<node,node,std::_Identity<node>,node_result_compare,std::allocator<node>> *)
               &local_520,
               &local_220.super__Tuple_impl<0UL,_baryonyx::problem,_baryonyx::problem>.
                super__Head_base<0UL,_baryonyx::problem,_false>._M_head_impl,(double *)&local_4f0,
               local_528,local_530);
    optimize(&local_4f0,&local_3a0,(problem *)&local_220);
    bVar5 = is_best(&local_3a0,&local_4f0,__return_storage_ptr__,
                    *(objective_function_type *)&__position[8]._M_left);
    if (bVar5) {
      (__return_storage_ptr__->strings).
      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_4f0.strings.super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (local_558,
                 &local_4f0.strings.
                  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      local_560->_M_len = local_4f0.method._M_len;
      local_560->_M_str = local_4f0.method._M_str;
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator=(&local_568->names,&local_4f0.affected_vars.names);
      std::vector<signed_char,_std::allocator<signed_char>_>::operator=
                (local_570,&local_4f0.affected_vars.values);
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator=(local_578,&local_4f0.variable_name);
      std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::operator=
                (local_580,&local_4f0.solutions);
      dVar1 = *local_550;
      dVar2 = local_550[1];
      dVar3 = local_550[2];
      dVar4 = local_550[3];
      *(result_status *)(local_588 + 4) = *(result_status *)(local_550 + 4);
      *local_588 = dVar1;
      local_588[1] = dVar2;
      local_588[2] = dVar3;
      local_588[3] = dVar4;
    }
    local_5a0 = 0.0;
    if (local_4f0.status == success) {
      local_5a0 = local_4f0.solutions.
                  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>.
                  _M_impl.super__Vector_impl_data._M_finish[-1].value;
    }
    std::_Rb_tree<node,node,std::_Identity<node>,node_result_compare,std::allocator<node>>::
    _M_emplace_equal<baryonyx::problem&,double,int&,int&>
              ((_Rb_tree<node,node,std::_Identity<node>,node_result_compare,std::allocator<node>> *)
               &local_520,(problem *)&local_220,&local_5a0,local_540,local_538);
    std::_Rb_tree<node,_node,_std::_Identity<node>,_node_result_compare,_std::allocator<node>_>::
    _M_erase_aux(&local_520,(const_iterator)__position);
    notice<>(&local_3a0,"    Jobs lists:\n");
    for (p_Var6 = local_520._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != p_Var7;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      if (p_Var6[9]._M_color == _S_red) {
        local_5a0 = (double)(*(long *)(p_Var6 + 8) - (long)p_Var6[7]._M_right);
        local_598 = ((long)p_Var6[6]._M_left - (long)p_Var6[6]._M_parent >> 2) * -0x5555555555555555
                    + (long)local_5a0;
        notice<double,int,unsigned_long,unsigned_long>
                  (&local_3a0,"    * solution: {} annoying: {} vars: {}/{}\n",
                   (double *)&p_Var6[8]._M_right,(int *)&p_Var6[9].field_0x4,
                   (unsigned_long *)&local_5a0,&local_598);
      }
      else {
        local_5a0 = (double)(*(long *)(p_Var6 + 8) - (long)p_Var6[7]._M_right);
        local_598 = ((long)p_Var6[6]._M_left - (long)p_Var6[6]._M_parent >> 2) * -0x5555555555555555
                    + (long)local_5a0;
        notice<int,int,unsigned_long,unsigned_long>
                  (&local_3a0,"    * remaining: {} annoying: {} vars: {}/{}\n",(int *)(p_Var6 + 9),
                   (int *)&p_Var6[9].field_0x4,(unsigned_long *)&local_5a0,&local_598);
      }
    }
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::~vector
              (&local_4f0.solutions);
    if (local_4f0.variable_name.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4f0.variable_name.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_4f0.variable_name.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_4f0.variable_name.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_4f0.affected_vars.values.super__Vector_base<signed_char,_std::allocator<signed_char>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4f0.affected_vars.values.
                      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_4f0.affected_vars.values.
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_4f0.affected_vars.values.
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_4f0.affected_vars.names.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4f0.affected_vars.names.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_4f0.affected_vars.names.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_4f0.affected_vars.names.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_4f0.strings.super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_4f0.strings.
                 super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::~vector
              (&local_448.solutions);
    if (local_448.variable_name.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_448.variable_name.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_448.variable_name.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_448.variable_name.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_448.affected_vars.values.super__Vector_base<signed_char,_std::allocator<signed_char>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_448.affected_vars.values.
                      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_448.affected_vars.values.
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_448.affected_vars.values.
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_448.affected_vars.names.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_448.affected_vars.names.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_448.affected_vars.names.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_448.affected_vars.names.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_448.strings.super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_448.strings.
                 super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
    problem::~problem(&local_220.super__Tuple_impl<0UL,_baryonyx::problem,_baryonyx::problem>.
                       super__Head_base<0UL,_baryonyx::problem,_false>._M_head_impl);
    problem::~problem((problem *)&local_220);
  } while (local_520._M_impl.super__Rb_tree_header._M_node_count != 0);
  std::_Rb_tree<node,_node,_std::_Identity<node>,_node_result_compare,_std::allocator<node>_>::
  ~_Rb_tree(&local_520);
  if (local_3a0.finish.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3a0.finish.super__Function_base._M_manager)
              ((_Any_data *)&local_3a0.finish,(_Any_data *)&local_3a0.finish,__destroy_functor);
  }
  if (local_3a0.update.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3a0.update.super__Function_base._M_manager)
              ((_Any_data *)&local_3a0.update,(_Any_data *)&local_3a0.update,__destroy_functor);
  }
  if (local_3a0.start.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3a0.start.super__Function_base._M_manager)
              ((_Any_data *)&local_3a0.start,(_Any_data *)&local_3a0.start,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0.method._M_dataplus._M_p != &local_3a0.method.field_2) {
    operator_delete(local_3a0.method._M_dataplus._M_p,
                    local_3a0.method.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

result
branch_optimize(const baryonyx::context& ctx, const baryonyx::problem& pb)
{
    baryonyx::notice(ctx, "- branch-optimization starts\n");
    return ::optimize(ctx, pb);
}